

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.cpp
# Opt level: O1

SolutionCollection *
InferExamAnswers::Algorithm::runAlgorithm
          (SolutionCollection *__return_storage_ptr__,ExamResults *examResults)

{
  uchar *puVar1;
  byte m;
  const_iterator cVar2;
  long lVar3;
  __node_base _Var4;
  ulong uVar5;
  ulong uVar6;
  uint64_t uVar7;
  valarray<unsigned_char> leftScore;
  ScoreMap leftScores;
  ScoreMap rightScores;
  key_type local_b8;
  ulong local_a8;
  _Hashtable<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a0;
  _Hashtable<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  m = examResults->questionCount >> 1;
  computeScoreMap((ScoreMap *)&local_68,examResults,'\0',m);
  local_a8 = (ulong)m;
  computeScoreMap((ScoreMap *)&local_a0,examResults,m,examResults->questionCount);
  __return_storage_ptr__->_vptr_SolutionCollection = (_func_int **)&PTR__SolutionCollection_0011dd30
  ;
  __return_storage_ptr__->solution = 0;
  __return_storage_ptr__->size = 0;
  if (local_68._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar7 = __return_storage_ptr__->size;
    uVar5 = 0;
    _Var4._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      local_b8._M_size = (examResults->scores)._M_size;
      local_b8._M_data = (uchar *)operator_new(local_b8._M_size);
      if (local_b8._M_size != 0) {
        puVar1 = (examResults->scores)._M_data;
        uVar6 = 0;
        do {
          local_b8._M_data[uVar6] =
               puVar1[uVar6] - *(char *)((long)&(_Var4._M_nxt[2]._M_nxt)->_M_nxt + uVar6);
          uVar6 = uVar6 + 1;
        } while (local_b8._M_size != uVar6);
      }
      cVar2 = std::
              _Hashtable<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_a0,&local_b8);
      if (cVar2.
          super__Node_iterator_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
          ._M_cur != (__node_type *)0x0) {
        lVar3 = (long)_Var4._M_nxt[5]._M_nxt *
                *(long *)((long)cVar2.
                                super__Node_iterator_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
                                ._M_cur + 0x28);
        if (lVar3 == 1 && uVar7 == 0) {
          uVar5 = *(long *)((long)cVar2.
                                  super__Node_iterator_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
                                  ._M_cur + 0x20) << ((byte)local_a8 & 0x3f) |
                  (ulong)_Var4._M_nxt[4]._M_nxt;
          uVar7 = 1;
        }
        else {
          uVar7 = uVar7 + lVar3;
        }
      }
      operator_delete(local_b8._M_data);
      _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt;
    } while (_Var4._M_nxt != (_Hash_node_base *)0x0);
    __return_storage_ptr__->size = uVar7;
  }
  __return_storage_ptr__->solution = uVar5;
  std::
  _Hashtable<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_a0);
  std::
  _Hashtable<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

SolutionCollection Algorithm::runAlgorithm(const ExamResults& examResults)
{
	/**
	 * We split the answers of all students into two parts. We brute force
	 * The possible exam solution for each side and then combine the results
	 */
	const uint8_t splitIndex = examResults.questionCount / 2;

	/**
	 * The results of the brute force computation of each side is stored
	 * in a map. The key is a valarray of the score of each student and the
	 * value are the associated solution(s). This way we can easily compute
	 * what the corresponding key is to a score in a map because we can
	 * subtract the key from the obtained scores to obtain the required key
	 * for the other half.
	 */
	const auto rightScores = computeScoreMap(examResults, 0, splitIndex);
	const auto leftScores = computeScoreMap(examResults, splitIndex, examResults.questionCount);

	SolutionCollection solutions;

	// Combine the left and right scores
	for (const auto& [rightScore, rightSolutions] : rightScores) {
		const std::valarray<uint8_t> leftScore = examResults.scores - rightScore;

		const auto it = leftScores.find(leftScore);
		if (it == leftScores.end()) {
			continue;
		}

		const auto& leftSolutions = it->second;

		/**
		 * we only actually add the solutions here if the cardinality of the cartesian
		 * product is 1 since if it is larger we aren't interested in the actual solution
		 * just the number of them so we can just add dummy solutions
		 */
		auto combinationCount = leftSolutions.getSize() * rightSolutions.getSize();
		if (solutions.getSize() == 0 && combinationCount == 1) {
			solutions.addSolution((leftSolutions.getSolution() << splitIndex) | rightSolutions.getSolution());
		} else {
			solutions.grow(combinationCount);
		}
	}

	return solutions;
}